

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator::GenerateMergingCode
          (ImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutablePrimitiveFieldGenerator *this_local;
  
  descriptor = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (other.has$capitalized_name$()) {\n  set$capitalized_name$(other.get$capitalized_name$());\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "if (other.get$capitalized_name$() != $default$) {\n  set$capitalized_name$(other.get$capitalized_name$());\n}\n"
                      );
  }
  return;
}

Assistant:

void ImmutablePrimitiveFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
      "if (other.has$capitalized_name$()) {\n"
      "  set$capitalized_name$(other.get$capitalized_name$());\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if (other.get$capitalized_name$() != $default$) {\n"
      "  set$capitalized_name$(other.get$capitalized_name$());\n"
      "}\n");
  }
}